

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::BufferErrorsTest::iterate(BufferErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  char *description;
  GLuint not_a_texture;
  uint uVar9;
  qpTestResult testResult;
  ErrorsUtilities *pEVar10;
  TestContext *this_00;
  GLuint not_a_buffer;
  GLuint buffer;
  GLuint texture_1D;
  GLuint texture_buffer;
  int local_2c;
  uint local_28;
  uint local_24;
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    local_24 = 0;
    local_28 = 0;
    local_2c = 0;
    (**(code **)(lVar8 + 0x400))(0x8c2a,1);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1f72);
    (**(code **)(lVar8 + 0x400))(0xde0,1,&local_28);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1f75);
    (**(code **)(lVar8 + 0x3b8))(1,&local_2c);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glCreateBuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1f78);
    (**(code **)(lVar8 + 0xec0))(local_2c,4,"\x01\x02\x03\x04",0x88e6);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1f7b);
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      cVar3 = (**(code **)(lVar8 + 0xcc8))(uVar9);
    } while (cVar3 != '\0');
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glIsTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1f84);
    pEVar10 = (ErrorsUtilities *)(ulong)uVar9;
    (**(code **)(lVar8 + 0x13d8))(pEVar10,0x8058,local_2c);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar10,(this->super_TestCase).m_context,0x502,"glTextureBuffer",
                       "texture is not the name of an existing texture object.");
    pEVar10 = (ErrorsUtilities *)(ulong)local_28;
    (**(code **)(lVar8 + 0x13d8))(pEVar10,0x8058,local_2c);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar10,(this->super_TestCase).m_context,0x500,"glTextureBuffer",
                       "the effective target of texture is not TEXTURE_BUFFER.");
    pEVar10 = (ErrorsUtilities *)(ulong)local_24;
    (**(code **)(lVar8 + 0x13d8))(pEVar10,0x8dbc,local_2c);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar10,(this->super_TestCase).m_context,0x500,"glTextureBuffer",
                       "internalformat is not one of the sized internal formats described above..");
    iVar6 = 0;
    do {
      iVar6 = iVar6 + 1;
      cVar3 = (**(code **)(lVar8 + 0xc68))(iVar6);
    } while (cVar3 != '\0');
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glIsBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1fa5);
    pEVar10 = (ErrorsUtilities *)(ulong)local_24;
    (**(code **)(lVar8 + 0x13d8))(pEVar10,0x8058,iVar6);
    bVar5 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar10,(this->super_TestCase).m_context,0x502,"glTextureBuffer",
                       "buffer is not zero and is not the name of an existing buffer object.");
    if (local_28 != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (local_24 != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (local_2c != 0) {
      (**(code **)(lVar8 + 0x438))(1);
    }
    do {
      iVar6 = (**(code **)(lVar8 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((bVar1 && bVar2) && bVar4) && bVar5) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult BufferErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	glw::GLuint texture_buffer = 0;
	glw::GLuint texture_1D	 = 0;
	glw::GLuint buffer		   = 0;

	static const glw::GLubyte data[4]   = { 1, 2, 3, 4 };
	static const glw::GLuint  data_size = sizeof(data);

	try
	{
		/* Auxiliary objects setup. */
		gl.createTextures(GL_TEXTURE_BUFFER, 1, &texture_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

		gl.createTextures(GL_TEXTURE_1D, 1, &texture_1D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

		gl.namedBufferData(buffer, data_size, data, GL_STATIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		/*  Check that INVALID_OPERATION is generated by glTextureBuffer if texture
		 is not the name of an existing texture object. */
		{
			glw::GLuint not_a_texture = 0;

			while (gl.isTexture(++not_a_texture))
				;
			GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");

			gl.textureBuffer(not_a_texture, GL_RGBA8, buffer);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureBuffer",
									  "texture is not the name of an existing texture object.");
		}

		/*  Check that INVALID_ENUM is generated by glTextureBuffer if the effective
		 target of texture is not TEXTURE_BUFFER. */
		{
			gl.textureBuffer(texture_1D, GL_RGBA8, buffer);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureBuffer",
									  "the effective target of texture is not TEXTURE_BUFFER.");
		}

		/*  Check that INVALID_ENUM is generated if internalformat is not one of the
		 sized internal formats described above. */
		{
			gl.textureBuffer(texture_buffer, GL_COMPRESSED_SIGNED_RED_RGTC1, buffer);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureBuffer",
									  "internalformat is not one of the sized internal formats described above..");
		}

		/*  Check that INVALID_OPERATION is generated if buffer is not zero and is
		 not the name of an existing buffer object. */
		{
			glw::GLuint not_a_buffer = 0;

			while (gl.isBuffer(++not_a_buffer))
				;
			GLU_EXPECT_NO_ERROR(gl.getError(), "glIsBuffer has failed");

			gl.textureBuffer(texture_buffer, GL_RGBA8, not_a_buffer);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureBuffer",
									  "buffer is not zero and is not the name of an existing buffer object.");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_1D)
	{
		gl.deleteTextures(1, &texture_1D);
	}

	if (texture_buffer)
	{
		gl.deleteTextures(1, &texture_buffer);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}